

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O2

BlockSet * __thiscall
spvtools::opt::InvocationInterlockPlacementPass::computeReachableBlocks
          (BlockSet *__return_storage_ptr__,InvocationInterlockPlacementPass *this,
          BlockSet *previous_inside,BlockSet *starting_nodes,bool reverse_cfg)

{
  uint32_t block_id;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  deque<unsigned_int,_std::allocator<unsigned_int>_> worklist;
  const_iterator local_78;
  iterator local_50;
  
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_Hashtable(&__return_storage_ptr__->_M_h,&starting_nodes->_M_h);
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_Deque_base
            ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)&worklist);
  local_78._M_cur =
       worklist.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_78._M_first =
       worklist.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_78._M_last =
       worklist.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_78._M_node =
       worklist.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  std::deque<unsigned_int,std::allocator<unsigned_int>>::
  insert<std::__detail::_Node_const_iterator<unsigned_int,true,false>,void>
            (&local_50,(deque<unsigned_int,std::allocator<unsigned_int>> *)&worklist,&local_78,
             (_Node_const_iterator<unsigned_int,_true,_false>)
             (starting_nodes->_M_h)._M_before_begin._M_nxt,
             (_Node_const_iterator<unsigned_int,_true,_false>)0x0);
  while (worklist.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur !=
         worklist.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur) {
    block_id = *worklist.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
    std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_front(&worklist);
    local_e8._8_8_ = 0;
    local_e8._M_unused._M_object = ::operator_new(0x18);
    *(BlockSet **)local_e8._M_unused._0_8_ = __return_storage_ptr__;
    *(BlockSet **)((long)local_e8._M_unused._0_8_ + 8) = previous_inside;
    *(deque<unsigned_int,std::allocator<unsigned_int>> **)((long)local_e8._M_unused._0_8_ + 0x10) =
         (deque<unsigned_int,std::allocator<unsigned_int>> *)&worklist;
    local_d0 = std::
               _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:252:17)>
               ::_M_invoke;
    local_d8 = std::
               _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:252:17)>
               ::_M_manager;
    forEachNext(this,block_id,reverse_cfg,(function<void_(unsigned_int)> *)&local_e8);
    if (local_d8 != (code *)0x0) {
      (*local_d8)(&local_e8,&local_e8,__destroy_functor);
    }
  }
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
            (&worklist.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return __return_storage_ptr__;
}

Assistant:

InvocationInterlockPlacementPass::BlockSet
InvocationInterlockPlacementPass::computeReachableBlocks(
    BlockSet& previous_inside, const BlockSet& starting_nodes,
    bool reverse_cfg) {
  BlockSet inside = starting_nodes;

  std::deque<uint32_t> worklist;
  worklist.insert(worklist.begin(), starting_nodes.begin(),
                  starting_nodes.end());

  while (!worklist.empty()) {
    uint32_t block_id = worklist.front();
    worklist.pop_front();

    forEachNext(block_id, reverse_cfg,
                [&inside, &previous_inside, &worklist](uint32_t next_id) {
                  previous_inside.insert(next_id);
                  if (inside.insert(next_id).second) {
                    worklist.push_back(next_id);
                  }
                });
  }

  return inside;
}